

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::remove_web_seed(torrent *this,string *url)

{
  bool bVar1;
  pointer pwVar2;
  _Self local_40;
  _List_node_base *local_38;
  _List_node_base *local_30;
  _List_iterator<libtorrent::aux::web_seed_t> local_28;
  _Self local_20;
  _List_iterator<libtorrent::aux::web_seed_t> i;
  string *url_local;
  torrent *this_local;
  
  i._M_node = (_List_node_base *)url;
  local_28._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::begin
                 (&this->m_web_seeds);
  local_30 = (_List_node_base *)
             ::std::__cxx11::
             list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::end
                       (&this->m_web_seeds);
  local_38 = i._M_node;
  local_20._M_node =
       (_List_node_base *)
       ::std::
       find_if<std::_List_iterator<libtorrent::aux::web_seed_t>,libtorrent::aux::torrent::remove_web_seed(std::__cxx11::string_const&)::__0>
                 (local_28,(_List_iterator<libtorrent::aux::web_seed_t>)local_30,i._M_node);
  local_40._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::end
                 (&this->m_web_seeds);
  bVar1 = ::std::operator!=(&local_20,&local_40);
  if (bVar1) {
    pwVar2 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->(&local_20);
    if ((pwVar2->ephemeral & 1U) == 0) {
      set_need_save_resume(this,(resume_data_flags_t)0x80);
    }
    remove_web_seed_iter(this,(iterator)local_20._M_node);
  }
  return;
}

Assistant:

void torrent::remove_web_seed(std::string const& url)
	{
		auto const i = std::find_if(m_web_seeds.begin(), m_web_seeds.end()
			, [&] (web_seed_t const& w) { return w.url == url; });

		if (i != m_web_seeds.end())
		{
			if (!i->ephemeral)
				set_need_save_resume(torrent_handle::if_metadata_changed);
			remove_web_seed_iter(i);
		}
	}